

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varset.h
# Opt level: O2

VarSet * __thiscall
libDAI::VarSet::operator/(VarSet *__return_storage_ptr__,VarSet *this,VarSet *ns)

{
  (__return_storage_ptr__->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->_statespace = 1;
  std::
  __set_difference<__gnu_cxx::__normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,__gnu_cxx::__normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,std::insert_iterator<std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_start,
             (ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_finish,__return_storage_ptr__,0);
  calcStateSpace(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

VarSet operator/ (const VarSet& ns) const {
                VarSet res;
                std::set_difference( _vars.begin(), _vars.end(), ns._vars.begin(), ns._vars.end(), inserter( res._vars, res._vars.begin() ) );
                res.calcStateSpace();
#ifdef DEBUG
                assert( is_sorted( res._vars.begin(), res._vars.end() ) );
#endif
                return res;
            }